

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_encodeSequences_default
                 (void *dst,size_t dstCapacity,FSE_CTable *CTable_MatchLength,BYTE *mlCodeTable,
                 FSE_CTable *CTable_OffsetBits,BYTE *ofCodeTable,FSE_CTable *CTable_LitLength,
                 BYTE *llCodeTable,seqDef *sequences,size_t nbSeq,int longOffsets)

{
  uint uVar1;
  uint uVar2;
  uint nbBits;
  uint uVar3;
  size_t code;
  int iVar4;
  BIT_CStream_t *in_RCX;
  size_t in_RSI;
  void *in_RDI;
  FSE_CState_t *in_R8;
  long in_R9;
  long in_stack_00000010;
  size_t streamSize;
  int extraBits_1;
  U32 mlBits;
  U32 ofBits_1;
  U32 llBits;
  BYTE mlCode;
  BYTE ofCode;
  BYTE llCode;
  size_t n;
  int extraBits;
  U32 ofBits;
  size_t errcod;
  FSE_CState_t stateLitLength;
  FSE_CState_t stateOffsetBits;
  FSE_CState_t stateMatchLength;
  BIT_CStream_t blockStream;
  uint in_stack_fffffffffffffe88;
  uint in_stack_fffffffffffffe8c;
  uint in_stack_fffffffffffffe90;
  uint in_stack_fffffffffffffe94;
  FSE_CTable *local_110;
  BIT_CStream_t local_98;
  int local_6c;
  FSE_CTable *local_68;
  BYTE *local_60;
  long local_58;
  long local_48;
  BIT_CStream_t *local_38;
  size_t local_18;
  
  local_58 = in_stack_00000010;
  local_60 = ofCodeTable;
  local_68 = CTable_OffsetBits;
  local_6c = (int)mlCodeTable;
  local_48 = in_R9;
  local_38 = in_RCX;
  code = BIT_initCStream(&local_98,in_RDI,in_RSI);
  uVar1 = ERR_isError(code);
  if (uVar1 == 0) {
    FSE_initCState2((FSE_CState_t *)in_RCX,(FSE_CTable *)in_R8,(U32)((ulong)in_R9 >> 0x20));
    FSE_initCState2((FSE_CState_t *)in_RCX,(FSE_CTable *)in_R8,(U32)((ulong)in_R9 >> 0x20));
    FSE_initCState2((FSE_CState_t *)in_RCX,(FSE_CTable *)in_R8,(U32)((ulong)in_R9 >> 0x20));
    BIT_addBits(&local_98,(ulong)*(ushort *)(local_60 + ((long)local_68 + -1) * 8 + 4),
                LL_bits[*(byte *)((long)local_68 + local_58 + -1)]);
    uVar1 = MEM_32bits();
    if (uVar1 != 0) {
      BIT_flushBits((BIT_CStream_t *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    }
    BIT_addBits(&local_98,(ulong)*(ushort *)(local_60 + ((long)local_68 + -1) * 8 + 6),
                ML_bits[*(byte *)((long)local_38 + (long)local_68 + -1)]);
    uVar1 = MEM_32bits();
    if (uVar1 != 0) {
      BIT_flushBits((BIT_CStream_t *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    }
    if (local_6c == 0) {
      BIT_addBits(&local_98,(ulong)*(uint *)(local_60 + ((long)local_68 + -1) * 8),
                  (uint)*(byte *)((long)local_68 + local_48 + -1));
    }
    else {
      uVar1 = (uint)*(byte *)((long)local_68 + local_48 + -1);
      uVar2 = MEM_32bits();
      iVar4 = 0x39;
      if (uVar2 != 0) {
        iVar4 = 0x19;
      }
      in_stack_fffffffffffffe94 = uVar1;
      if (iVar4 - 1U <= uVar1) {
        uVar2 = MEM_32bits();
        iVar4 = 0x39;
        if (uVar2 != 0) {
          iVar4 = 0x19;
        }
        in_stack_fffffffffffffe94 = iVar4 - 1;
      }
      uVar2 = uVar1 - in_stack_fffffffffffffe94;
      if (uVar2 != 0) {
        BIT_addBits(&local_98,(ulong)*(uint *)(local_60 + ((long)local_68 + -1) * 8),uVar2);
        BIT_flushBits((BIT_CStream_t *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90)
                     );
      }
      BIT_addBits(&local_98,
                  (ulong)(*(uint *)(local_60 + ((long)local_68 + -1) * 8) >> ((byte)uVar2 & 0x1f)),
                  uVar1 - uVar2);
    }
    BIT_flushBits((BIT_CStream_t *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    for (local_110 = (FSE_CTable *)((long)local_68 + -2); local_110 < local_68;
        local_110 = (FSE_CTable *)((long)local_110 + -1)) {
      uVar1 = LL_bits[*(byte *)(local_58 + (long)local_110)];
      nbBits = (uint)*(byte *)(local_48 + (long)local_110);
      uVar2 = ML_bits[*(byte *)((long)&local_38->bitContainer + (long)local_110)];
      FSE_encodeSymbol(in_RCX,in_R8,(U32)((ulong)in_R9 >> 0x20));
      FSE_encodeSymbol(in_RCX,in_R8,(U32)((ulong)in_R9 >> 0x20));
      uVar3 = MEM_32bits();
      if (uVar3 != 0) {
        BIT_flushBits((BIT_CStream_t *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90)
                     );
      }
      FSE_encodeSymbol(in_RCX,in_R8,(U32)((ulong)in_R9 >> 0x20));
      uVar3 = MEM_32bits();
      if ((uVar3 != 0) || (0x1e < nbBits + uVar2 + uVar1)) {
        BIT_flushBits((BIT_CStream_t *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90)
                     );
      }
      BIT_addBits(&local_98,(ulong)*(ushort *)(local_60 + (long)local_110 * 8 + 4),uVar1);
      uVar3 = MEM_32bits();
      if ((uVar3 != 0) && (0x18 < uVar1 + uVar2)) {
        BIT_flushBits((BIT_CStream_t *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90)
                     );
      }
      BIT_addBits(&local_98,(ulong)*(ushort *)(local_60 + (long)local_110 * 8 + 6),uVar2);
      uVar3 = MEM_32bits();
      if ((uVar3 != 0) || (0x38 < nbBits + uVar2 + uVar1)) {
        BIT_flushBits((BIT_CStream_t *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90)
                     );
      }
      if (local_6c == 0) {
        BIT_addBits(&local_98,(ulong)*(uint *)(local_60 + (long)local_110 * 8),nbBits);
      }
      else {
        in_stack_fffffffffffffe8c = nbBits;
        in_stack_fffffffffffffe90 = nbBits;
        uVar1 = MEM_32bits();
        iVar4 = 0x39;
        if (uVar1 != 0) {
          iVar4 = 0x19;
        }
        in_stack_fffffffffffffe88 = nbBits;
        if (iVar4 - 1U <= in_stack_fffffffffffffe90) {
          uVar1 = MEM_32bits();
          iVar4 = 0x39;
          if (uVar1 != 0) {
            iVar4 = 0x19;
          }
          in_stack_fffffffffffffe88 = iVar4 - 1;
        }
        uVar1 = in_stack_fffffffffffffe8c - in_stack_fffffffffffffe88;
        if (uVar1 != 0) {
          BIT_addBits(&local_98,(ulong)*(uint *)(local_60 + (long)local_110 * 8),uVar1);
          BIT_flushBits((BIT_CStream_t *)
                        CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
        }
        BIT_addBits(&local_98,
                    (ulong)(*(uint *)(local_60 + (long)local_110 * 8) >> ((byte)uVar1 & 0x1f)),
                    nbBits - uVar1);
      }
      BIT_flushBits((BIT_CStream_t *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    }
    FSE_flushCState((BIT_CStream_t *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                    (FSE_CState_t *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    FSE_flushCState((BIT_CStream_t *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                    (FSE_CState_t *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    FSE_flushCState((BIT_CStream_t *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                    (FSE_CState_t *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    local_18 = BIT_closeCStream((BIT_CStream_t *)
                                CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    if (local_18 == 0) {
      local_18 = 0xffffffffffffffba;
    }
  }
  else {
    local_18 = 0xffffffffffffffba;
  }
  return local_18;
}

Assistant:

static size_t
ZSTD_encodeSequences_default(
            void* dst, size_t dstCapacity,
            FSE_CTable const* CTable_MatchLength, BYTE const* mlCodeTable,
            FSE_CTable const* CTable_OffsetBits, BYTE const* ofCodeTable,
            FSE_CTable const* CTable_LitLength, BYTE const* llCodeTable,
            seqDef const* sequences, size_t nbSeq, int longOffsets)
{
    return ZSTD_encodeSequences_body(dst, dstCapacity,
                                    CTable_MatchLength, mlCodeTable,
                                    CTable_OffsetBits, ofCodeTable,
                                    CTable_LitLength, llCodeTable,
                                    sequences, nbSeq, longOffsets);
}